

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_pool.cpp
# Opt level: O1

void __thiscall duckdb::EvictionQueue::Purge(EvictionQueue *this)

{
  __int_type _Var1;
  __int_type _Var2;
  ConcurrentQueueProducerTypelessBase *pCVar3;
  __pointer_type pPVar4;
  int iVar5;
  __pointer_type pPVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  iVar5 = pthread_mutex_trylock((pthread_mutex_t *)&this->purge_lock);
  if (iVar5 != 0) {
    return;
  }
  pPVar6 = (this->q).producerListTail._M_b._M_p;
  if (pPVar6 == (__pointer_type)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = 0;
    do {
      _Var1 = (pPVar6->tailIndex).super___atomic_base<unsigned_long>._M_i;
      _Var2 = (pPVar6->headIndex).super___atomic_base<unsigned_long>._M_i;
      lVar9 = _Var1 - _Var2;
      if (_Var2 - _Var1 < 0x8000000000000001) {
        lVar9 = 0;
      }
      uVar10 = uVar10 + lVar9;
      pCVar3 = (pPVar6->super_ConcurrentQueueProducerTypelessBase).next;
      pPVar6 = (__pointer_type)&pCVar3[-1].token;
    } while (pCVar3 != (ConcurrentQueueProducerTypelessBase *)0x0);
  }
  if (0x7fff < uVar10) {
    uVar10 = uVar10 >> 0xd;
    do {
      if (uVar10 == 0) break;
      PurgeIteration(this,0x2000);
      pPVar6 = (this->q).producerListTail._M_b._M_p;
      uVar7 = 0;
      pPVar4 = pPVar6;
      while (pPVar4 != (__pointer_type)0x0) {
        _Var1 = (pPVar6->tailIndex).super___atomic_base<unsigned_long>._M_i;
        _Var2 = (pPVar6->headIndex).super___atomic_base<unsigned_long>._M_i;
        lVar9 = _Var1 - _Var2;
        if (_Var2 - _Var1 < 0x8000000000000001) {
          lVar9 = 0;
        }
        uVar7 = uVar7 + lVar9;
        pPVar4 = (__pointer_type)(pPVar6->super_ConcurrentQueueProducerTypelessBase).next;
        pPVar6 = (__pointer_type)&pPVar4[-1].parent;
      }
      if (uVar7 < 0x8000) break;
      uVar8 = (this->total_dead_nodes).super___atomic_base<unsigned_long>._M_i;
      if (uVar7 <= uVar8) {
        uVar8 = uVar7;
      }
      uVar7 = (uVar7 - uVar8) * 3;
      uVar10 = uVar10 - (uVar7 <= uVar8);
    } while (uVar7 <= uVar8);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->purge_lock);
  return;
}

Assistant:

void EvictionQueue::Purge() {
	// only one thread purges the queue, all other threads early-out
	if (!purge_lock.try_lock()) {
		return;
	}
	lock_guard<mutex> lock {purge_lock, std::adopt_lock};

	// we purge INSERT_INTERVAL * PURGE_SIZE_MULTIPLIER nodes
	idx_t purge_size = INSERT_INTERVAL * PURGE_SIZE_MULTIPLIER;

	// get an estimate of the queue size as-of now
	idx_t approx_q_size = q.size_approx();

	// early-out, if the queue is not big enough to justify purging
	// - we want to keep the LRU characteristic alive
	if (approx_q_size < purge_size * EARLY_OUT_MULTIPLIER) {
		return;
	}

	// There are two types of situations.

	// For most scenarios, purging INSERT_INTERVAL * PURGE_SIZE_MULTIPLIER nodes is enough.
	// Purging more nodes than we insert also counters oscillation for scenarios where most nodes are dead.
	// If we always purge slightly more, we trigger a purge less often, as we purge below the trigger.

	// However, if the pressure on the queue becomes too contested, we need to purge more aggressively,
	// i.e., we actively seek a specific number of dead nodes to purge. We use the total number of existing dead nodes.
	// We detect this situation by observing the queue's ratio between alive vs. dead nodes. If the ratio of alive vs.
	// dead nodes grows faster than we can purge, we keep purging until we hit one of the following conditions.

	// 2.1. We're back at an approximate queue size less than purge_size * EARLY_OUT_MULTIPLIER.
	// 2.2. We're back at a ratio of 1*alive_node:ALIVE_NODE_MULTIPLIER*dead_nodes.
	// 2.3. We've purged the entire queue: max_purges is zero. This is a worst-case scenario,
	// guaranteeing that we always exit the loop.

	idx_t max_purges = approx_q_size / purge_size;
	while (max_purges != 0) {
		PurgeIteration(purge_size);

		// update relevant sizes and potentially early-out
		approx_q_size = q.size_approx();

		// early-out according to (2.1)
		if (approx_q_size < purge_size * EARLY_OUT_MULTIPLIER) {
			break;
		}

		idx_t approx_dead_nodes = total_dead_nodes;
		approx_dead_nodes = approx_dead_nodes > approx_q_size ? approx_q_size : approx_dead_nodes;
		idx_t approx_alive_nodes = approx_q_size - approx_dead_nodes;

		// early-out according to (2.2)
		if (approx_alive_nodes * (ALIVE_NODE_MULTIPLIER - 1) > approx_dead_nodes) {
			break;
		}

		max_purges--;
	}
}